

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
Filter::predict(vector<float,_std::allocator<float>_> *__return_storage_ptr__,Filter *this)

{
  double dVar1;
  uint uVar2;
  int *piVar3;
  iterator __position;
  double dVar4;
  int iVar5;
  long lVar6;
  float *pfVar7;
  Mat *pMVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  Mat estimated;
  Mat local_80;
  byte local_7f;
  int local_74;
  long local_70;
  int *local_40;
  long *local_38;
  
  dVar1 = this->ticks;
  lVar6 = cv::getTickCount();
  this->ticks = (double)lVar6;
  dVar4 = (double)cv::getTickFrequency();
  fVar11 = (float)(((double)lVar6 - dVar1) / dVar4);
  uVar2 = *(uint *)&(this->KF).transitionMatrix;
  if (((uVar2 >> 0xe & 1) == 0) && (piVar3 = *(int **)&(this->KF).field_0x100, *piVar3 != 1)) {
    if (piVar3[1] == 1) {
      pfVar7 = (float *)(**(long **)&(this->KF).field_0x108 * 2 + *(long *)&(this->KF).field_0xd0);
    }
    else {
      lVar6 = (long)*(int *)&(this->KF).field_0xcc;
      pfVar7 = (float *)((long)(int)(2 / lVar6) * **(long **)&(this->KF).field_0x108 +
                         *(long *)&(this->KF).field_0xd0 + (2 % lVar6 & 0xffffffffU) * 4);
    }
  }
  else {
    pfVar7 = (float *)(*(long *)&(this->KF).field_0xd0 + 8);
  }
  *pfVar7 = fVar11;
  if (((uVar2 >> 0xe & 1) == 0) && (piVar3 = *(int **)&(this->KF).field_0x100, *piVar3 != 1)) {
    if (piVar3[1] == 1) {
      pfVar7 = (float *)(**(long **)&(this->KF).field_0x108 * 7 + *(long *)&(this->KF).field_0xd0);
    }
    else {
      lVar6 = (long)*(int *)&(this->KF).field_0xcc;
      pfVar7 = (float *)((long)(int)(7 / lVar6) * **(long **)&(this->KF).field_0x108 +
                         *(long *)&(this->KF).field_0xd0 + (7 % lVar6 & 0xffffffffU) * 4);
    }
  }
  else {
    pfVar7 = (float *)(*(long *)&(this->KF).field_0xd0 + 0x1c);
  }
  *pfVar7 = fVar11;
  cv::Mat::Mat(&local_80);
  cv::KalmanFilter::predict(&(this->KF).statePre);
  cv::Mat::~Mat(&local_80);
  pMVar8 = (Mat *)cv::KalmanFilter::correct(&(this->KF).statePre);
  cv::Mat::Mat(&local_80,pMVar8);
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < this->stateSize) {
    lVar6 = 0;
    uVar10 = 0;
    do {
      if (((local_7f & 0x40) == 0) && (*local_40 != 1)) {
        if (local_40[1] == 1) {
          lVar9 = *local_38 * uVar10;
          goto LAB_0010ff3c;
        }
        iVar5 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                     (long)local_74);
        pfVar7 = (float *)((long)iVar5 * *local_38 + (long)(local_74 * iVar5) * -4 + local_70 +
                          lVar6);
      }
      else {
        lVar9 = uVar10 * 4;
LAB_0010ff3c:
        pfVar7 = (float *)(lVar9 + local_70);
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float&>
                  ((vector<float,std::allocator<float>> *)__return_storage_ptr__,__position,pfVar7);
      }
      else {
        *__position._M_current = *pfVar7;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar10 = uVar10 + 1;
      lVar6 = lVar6 + 4;
    } while ((long)uVar10 < (long)this->stateSize);
  }
  cv::Mat::~Mat(&local_80);
  return __return_storage_ptr__;
}

Assistant:

vector<float> Filter::predict() {
    double precTick = ticks;
    ticks = (double) getTickCount();
    double dT = (ticks - precTick) / getTickFrequency();

    KF.transitionMatrix.at<float>(2) = dT;
    KF.transitionMatrix.at<float>(7) = dT;
    KF.predict();
    Mat estimated = KF.correct(meas);
    vector<float> res;
    for (int i = 0; i < stateSize; i++) {
        res.emplace_back(estimated.at<float>(i));
    }
    return res;
}